

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v256_intrinsics_c.h
# Opt level: O0

c_v256 * c_v256_min_s32(c_v256 a,c_v256 b)

{
  c_v256 *in_RDI;
  c_v128 cVar1;
  c_v128 cVar2;
  undefined1 in_stack_00000008 [16];
  undefined8 in_stack_00000018;
  undefined8 in_stack_00000020;
  undefined1 in_stack_00000028 [16];
  undefined8 in_stack_00000038;
  undefined8 in_stack_00000040;
  
  cVar2.u64[1] = in_stack_00000020;
  cVar2.u64[0] = in_stack_00000018;
  cVar1.u64[1] = in_stack_00000040;
  cVar1.u64[0] = in_stack_00000038;
  cVar1 = c_v128_min_s32(cVar2,cVar1);
  cVar2 = c_v128_min_s32((c_v128)in_stack_00000008,(c_v128)in_stack_00000028);
  c_v256_from_v128(in_RDI,cVar1,cVar2);
  return in_RDI;
}

Assistant:

SIMD_INLINE c_v256 c_v256_min_s32(c_v256 a, c_v256 b) {
  return c_v256_from_v128(c_v128_min_s32(a.v128[1], b.v128[1]),
                          c_v128_min_s32(a.v128[0], b.v128[0]));
}